

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O1

bool __thiscall FileReaderLZSS::UncompressBlock(FileReaderLZSS *this)

{
  uint *puVar1;
  BYTE **ppBVar2;
  BYTE BVar3;
  ushort uVar4;
  BYTE *pBVar5;
  ushort *puVar6;
  ushort uVar7;
  ushort uVar8;
  byte bVar9;
  uint uVar10;
  byte *__src;
  uint uVar11;
  
  if (((this->Stream).CFlags & 1) == 0) {
    pBVar5 = (this->Stream).In;
    (this->Stream).In = pBVar5 + 1;
    BVar3 = *pBVar5;
    pBVar5 = (this->Stream).InternalBuffer;
    (this->Stream).InternalBuffer = pBVar5 + 1;
    *pBVar5 = BVar3;
    puVar1 = &(this->Stream).AvailIn;
    *puVar1 = *puVar1 - 1;
    puVar1 = &(this->Stream).InternalOut;
    *puVar1 = *puVar1 + 1;
  }
  else {
    uVar10 = (this->Stream).AvailIn;
    if (uVar10 < 2) {
      return false;
    }
    (this->Stream).AvailIn = uVar10 - 2;
    puVar6 = (ushort *)(this->Stream).In;
    uVar4 = *puVar6;
    uVar7 = uVar4 >> 8;
    uVar8 = uVar4 << 8 | uVar7;
    (this->Stream).In = (BYTE *)(puVar6 + 1);
    if ((uVar7 & 0xf) == 0) {
      (this->Stream).State = STREAM_FINAL;
    }
    else {
      bVar9 = ((byte)(uVar4 >> 8) & 0xf) + 1;
      uVar4 = uVar8 >> 4;
      uVar10 = (uint)uVar4;
      pBVar5 = (this->Stream).InternalBuffer;
      __src = pBVar5 + ~(ulong)uVar10;
      if (uVar8 < 0x10) {
        memset(pBVar5,(uint)*__src,(ulong)bVar9);
      }
      else if (uVar4 < bVar9) {
        do {
          uVar11 = (uVar10 & 0xffff) + 1;
          if (bVar9 < uVar11) {
            uVar11 = (uint)bVar9;
          }
          memcpy((this->Stream).InternalBuffer,__src,(ulong)uVar11);
          ppBVar2 = &(this->Stream).InternalBuffer;
          *ppBVar2 = *ppBVar2 + uVar11;
          puVar1 = &(this->Stream).InternalOut;
          *puVar1 = *puVar1 + uVar11;
          uVar10 = uVar11 + uVar10;
          bVar9 = bVar9 - (char)uVar11;
        } while (bVar9 != 0);
        bVar9 = 0;
      }
      else {
        memcpy(pBVar5,__src,(ulong)bVar9);
      }
      puVar1 = &(this->Stream).InternalOut;
      *puVar1 = *puVar1 + (uint)bVar9;
      ppBVar2 = &(this->Stream).InternalBuffer;
      *ppBVar2 = *ppBVar2 + bVar9;
    }
    if ((uVar7 & 0xf) == 0) {
      return true;
    }
  }
  pBVar5 = &(this->Stream).CFlags;
  *pBVar5 = *pBVar5 >> 1;
  bVar9 = (this->Stream).Bits;
  (this->Stream).Bits = bVar9 >> 1;
  if (bVar9 < 2) {
    (this->Stream).State = STREAM_FLUSH;
  }
  return true;
}

Assistant:

bool UncompressBlock()
	{
		if(Stream.CFlags & 1)
		{
			// Check to see if we have enough input
			if(Stream.AvailIn < 2)
				return false;
			Stream.AvailIn -= 2;

			WORD pos = BigShort(*(WORD*)Stream.In);
			BYTE len = (pos & 0xF)+1;
			pos >>= 4;
			Stream.In += 2;
			if(len == 1)
			{
				// We've reached the end of the stream.
				Stream.State = STREAM_FINAL;
				return true;
			}

			const BYTE* copyStart = Stream.InternalBuffer-pos-1;

			// Complete overlap: Single byte repeated
			if(pos == 0)
				memset(Stream.InternalBuffer, *copyStart, len);
			// No overlap: One copy
			else if(pos >= len)
				memcpy(Stream.InternalBuffer, copyStart, len);
			else
			{
				// Partial overlap: Copy in 2 or 3 chunks.
				do
				{
					unsigned int copy = MIN<unsigned int>(len, pos+1);
					memcpy(Stream.InternalBuffer, copyStart, copy);
					Stream.InternalBuffer += copy;
					Stream.InternalOut += copy;
					len -= copy;
					pos += copy; // Increase our position since we can copy twice as much the next round.
				}
				while(len);
			}

			Stream.InternalOut += len;
			Stream.InternalBuffer += len;
		}
		else
		{
			// Uncompressed byte.
			*Stream.InternalBuffer++ = *Stream.In++;
			--Stream.AvailIn;
			++Stream.InternalOut;
		}

		Stream.CFlags >>= 1;
		Stream.Bits >>= 1;

		// If we're done with this block, flush the output
		if(Stream.Bits == 0)
			Stream.State = STREAM_FLUSH;

		return true;
	}